

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O1

bool __thiscall SuperCardPro::WriteExact(SuperCardPro *this,void *buf,int len)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int bytes_written;
  int local_2c;
  
  local_2c = 0;
  bVar3 = len < 1;
  if (len < 1) {
LAB_001702a5:
    usleep(5000);
  }
  else {
    iVar1 = (*this->_vptr_SuperCardPro[3])();
    if ((char)iVar1 != '\0') {
      do {
        bVar3 = len - local_2c < 1;
        uVar2 = len - local_2c;
        if (uVar2 == 0 || len < local_2c) goto LAB_001702a5;
        buf = (void *)((long)buf + (long)local_2c);
        iVar1 = (*this->_vptr_SuperCardPro[3])(this,buf,(ulong)uVar2,&local_2c);
        len = uVar2;
      } while ((char)iVar1 != '\0');
    }
  }
  return bVar3;
}

Assistant:

bool SuperCardPro::WriteExact(const void* buf, int len)
{
    auto p = reinterpret_cast<const uint8_t*>(buf);
    auto bytes_written = 0;

    while (len > 0)
    {
        if (!Write(p, len, &bytes_written))
            return false;

        len -= bytes_written;
        p += bytes_written;
    }

#ifndef _WIN32
    // ToDo: find why the Raspberry Pi needs this.
    usleep(5000);
#endif

    return true;
}